

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O0

Statistics * __thiscall asmjit::v1_14::JitAllocator::statistics(JitAllocator *this)

{
  ulong uVar1;
  long lVar2;
  long *in_RSI;
  Statistics *in_RDI;
  JitAllocatorPool *pool;
  size_t poolId;
  size_t poolCount;
  LockGuard guard;
  JitAllocatorPrivateImpl *impl;
  ulong local_80;
  pthread_mutex_t *local_70;
  long local_68;
  undefined1 local_58 [48];
  pthread_mutex_t *local_28;
  pthread_mutex_t **local_20;
  pthread_mutex_t **local_18;
  pthread_mutex_t *local_10;
  pthread_mutex_t *local_8;
  
  memset(local_58,0,0x28);
  memcpy(in_RDI,local_58,0x28);
  if ((undefined1 *)*in_RSI != JitAllocatorImpl_none) {
    local_68 = *in_RSI;
    local_28 = (pthread_mutex_t *)(local_68 + 0x10);
    local_20 = &local_70;
    local_10 = local_28;
    local_70 = local_28;
    pthread_mutex_lock(local_28);
    uVar1 = *(ulong *)(local_68 + 0x58);
    for (local_80 = 0; local_80 < uVar1; local_80 = local_80 + 1) {
      lVar2 = *(long *)(local_68 + 0x50) + local_80 * 0x48;
      in_RDI->_blockCount = (ulong)*(uint *)(lVar2 + 0x18) + in_RDI->_blockCount;
      in_RDI->_reservedSize =
           (*(long *)(lVar2 + 0x20) + *(long *)(lVar2 + 0x28)) * (ulong)*(ushort *)(lVar2 + 0x1c) +
           in_RDI->_reservedSize;
      in_RDI->_usedSize =
           (*(long *)(lVar2 + 0x30) + *(long *)(lVar2 + 0x38)) * (ulong)*(ushort *)(lVar2 + 0x1c) +
           in_RDI->_usedSize;
      in_RDI->_overheadSize = *(long *)(lVar2 + 0x40) + in_RDI->_overheadSize;
    }
    in_RDI->_allocationCount = *(size_t *)(local_68 + 0x40);
    local_18 = &local_70;
    local_8 = local_70;
    pthread_mutex_unlock(local_70);
  }
  return in_RDI;
}

Assistant:

JitAllocator::Statistics JitAllocator::statistics() const noexcept {
  Statistics statistics;
  statistics.reset();

  if (ASMJIT_LIKELY(_impl != &JitAllocatorImpl_none)) {
    JitAllocatorPrivateImpl* impl = static_cast<JitAllocatorPrivateImpl*>(_impl);
    LockGuard guard(impl->lock);

    size_t poolCount = impl->poolCount;
    for (size_t poolId = 0; poolId < poolCount; poolId++) {
      const JitAllocatorPool& pool = impl->pools[poolId];
      statistics._blockCount   += size_t(pool.blockCount);
      statistics._reservedSize += size_t(pool.totalAreaSize[0] + pool.totalAreaSize[1]) * pool.granularity;
      statistics._usedSize     += size_t(pool.totalAreaUsed[0] + pool.totalAreaUsed[1]) * pool.granularity;
      statistics._overheadSize += size_t(pool.totalOverheadBytes);
    }

    statistics._allocationCount = impl->allocationCount;
  }

  return statistics;
}